

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

parse_state __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::parent
          (basic_json_parser<char,_std::allocator<char>_> *this)

{
  size_type sVar1;
  string *s;
  const_reference pvVar2;
  long in_RDI;
  vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *in_stack_ffffffffffffffb0;
  assertion_error *this_00;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  sVar1 = std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::size
                    ((vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *)
                     (in_RDI + 200));
  if (sVar1 == 0) {
    s = (string *)__cxa_allocate_exception(0x10);
    this_00 = (assertion_error *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    assertion_error::assertion_error(this_00,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar2 = std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::back
                     (in_stack_ffffffffffffffb0);
  return *pvVar2;
}

Assistant:

parse_state parent() const
    {
        JSONCONS_ASSERT(state_stack_.size() >= 1);
        return state_stack_.back();
    }